

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareWithFieldsInternal
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *message1_fields,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *message2_fields,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  bool bVar1;
  const_reference ppFVar2;
  DescriptorStringView psVar3;
  SpecificField *pSVar4;
  bool local_119;
  bool local_10d;
  int local_10c;
  int local_fc;
  SpecificField *specific_field_5;
  byte local_c9;
  SpecificField *pSStack_c8;
  bool fieldDifferent;
  SpecificField *specific_field_4;
  SpecificField *specific_field_3;
  int i_1;
  int count_1;
  SpecificField *specific_field_2;
  byte local_89;
  SpecificField *pSStack_88;
  bool ignore_field;
  SpecificField *specific_field_1;
  int i;
  int count;
  SpecificField *specific_field;
  FieldDescriptor *field2;
  FieldDescriptor *field1;
  Reflection *reflection2;
  Reflection *reflection1;
  int local_48;
  int field_index2;
  int field_index1;
  bool isDifferent;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *message2_fields_local;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *message1_fields_local;
  Message *pMStack_28;
  int unpacked_any_local;
  Message *message2_local;
  Message *message1_local;
  MessageDifferencer *this_local;
  
  field_index2._3_1_ = 0;
  local_48 = 0;
  reflection1._4_4_ = 0;
  _field_index1 = message2_fields;
  message2_fields_local = message1_fields;
  message1_fields_local._4_4_ = unpacked_any;
  pMStack_28 = message2;
  message2_local = message1;
  message1_local = (Message *)this;
  reflection2 = Message::GetReflection(message1);
  field1 = (FieldDescriptor *)Message::GetReflection(pMStack_28);
  while( true ) {
    while( true ) {
      while( true ) {
        ppFVar2 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](message2_fields_local,(long)local_48);
        field2 = *ppFVar2;
        ppFVar2 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](_field_index1,(long)reflection1._4_4_);
        specific_field = (SpecificField *)*ppFVar2;
        if ((field2 == (FieldDescriptor *)0x0) && (specific_field == (SpecificField *)0x0)) {
          return (bool)((field_index2._3_1_ ^ 0xff) & 1);
        }
        bVar1 = FieldBefore(field2,(FieldDescriptor *)specific_field);
        if (bVar1) break;
        bVar1 = FieldBefore((FieldDescriptor *)specific_field,field2);
        if (bVar1) {
          local_89 = IsIgnored(this,message2_local,pMStack_28,(FieldDescriptor *)specific_field,
                               parent_fields);
          if ((!(bool)local_89) &&
             (bVar1 = absl::lts_20240722::container_internal::
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      ::contains<google::protobuf::FieldDescriptor_const*>
                                ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                                  *)&this->force_compare_no_presence_fields_,
                                 (key_arg<const_google::protobuf::FieldDescriptor_*> *)
                                 &specific_field), bVar1)) {
            psVar3 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)specific_field);
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::
            emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                      ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                        *)&specific_field_2,
                       &(this->force_compare_failure_triggering_fields_).
                        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ,psVar3);
          }
          if ((local_89 & 1) == 0) {
            if (this->reporter_ == (Reporter *)0x0) {
              return false;
            }
            bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)specific_field);
            if (bVar1) {
              local_10c = Reflection::FieldSize
                                    ((Reflection *)field1,pMStack_28,
                                     (FieldDescriptor *)specific_field);
            }
            else {
              local_10c = 1;
            }
            specific_field_3._4_4_ = local_10c;
            for (specific_field_3._0_4_ = 0; (int)specific_field_3 < specific_field_3._4_4_;
                specific_field_3._0_4_ = (int)specific_field_3 + 1) {
              specific_field_4 = PushSpecificField(parent_fields);
              specific_field_4->message1 = message2_local;
              specific_field_4->message2 = pMStack_28;
              specific_field_4->unpacked_any = message1_fields_local._4_4_;
              specific_field_4->field = (FieldDescriptor *)specific_field;
              bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)specific_field);
              if (bVar1) {
                specific_field_4->index = (int)specific_field_3;
                AddSpecificNewIndex(specific_field_4,pMStack_28,(FieldDescriptor *)specific_field,
                                    (int)specific_field_3);
              }
              else {
                specific_field_4->index = -1;
                specific_field_4->new_index = -1;
              }
              local_10d = false;
              if ((this->force_compare_no_presence_ & 1U) != 0) {
                local_10d = absl::lts_20240722::container_internal::
                            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                            ::contains<google::protobuf::FieldDescriptor_const*>
                                      ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                                        *)&this->force_compare_no_presence_fields_,
                                       &specific_field_4->field);
              }
              specific_field_4->forced_compare_no_presence_ = local_10d;
              (*this->reporter_->_vptr_Reporter[2])
                        (this->reporter_,message2_local,pMStack_28,parent_fields);
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              ::pop_back(parent_fields);
            }
            field_index2._3_1_ = 1;
            reflection1._4_4_ = reflection1._4_4_ + 1;
          }
          else {
            if (this->reporter_ != (Reporter *)0x0) {
              _i_1 = PushSpecificField(parent_fields);
              _i_1->message1 = message2_local;
              _i_1->message2 = pMStack_28;
              _i_1->unpacked_any = message1_fields_local._4_4_;
              _i_1->field = (FieldDescriptor *)specific_field;
              if ((this->report_ignores_ & 1U) != 0) {
                (*this->reporter_->_vptr_Reporter[7])
                          (this->reporter_,message2_local,pMStack_28,parent_fields);
              }
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              ::pop_back(parent_fields);
            }
            reflection1._4_4_ = reflection1._4_4_ + 1;
          }
        }
        else {
          bVar1 = IsIgnored(this,message2_local,pMStack_28,field2,parent_fields);
          if (bVar1) {
            if (this->reporter_ != (Reporter *)0x0) {
              pSStack_c8 = PushSpecificField(parent_fields);
              pSStack_c8->message1 = message2_local;
              pSStack_c8->message2 = pMStack_28;
              pSStack_c8->unpacked_any = message1_fields_local._4_4_;
              pSStack_c8->field = field2;
              if ((this->report_ignores_ & 1U) != 0) {
                (*this->reporter_->_vptr_Reporter[7])
                          (this->reporter_,message2_local,pMStack_28,parent_fields);
              }
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              ::pop_back(parent_fields);
            }
            local_48 = local_48 + 1;
            reflection1._4_4_ = reflection1._4_4_ + 1;
          }
          else {
            local_c9 = 0;
            if (field2 == (FieldDescriptor *)0x0) {
              __assert_fail("field1 != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                            ,0x3d5,
                            "bool google::protobuf::util::MessageDifferencer::CompareWithFieldsInternal(const Message &, const Message &, int, const std::vector<const FieldDescriptor *> &, const std::vector<const FieldDescriptor *> &, std::vector<SpecificField> *)"
                           );
            }
            bVar1 = FieldDescriptor::is_map(field2);
            if (bVar1) {
              bVar1 = CompareMapField(this,message2_local,pMStack_28,message1_fields_local._4_4_,
                                      field2,parent_fields);
              local_c9 = (bVar1 ^ 0xffU) & 1;
            }
            else {
              bVar1 = FieldDescriptor::is_repeated(field2);
              if (bVar1) {
                bVar1 = CompareRepeatedField
                                  (this,message2_local,pMStack_28,message1_fields_local._4_4_,field2
                                   ,parent_fields);
                local_c9 = (bVar1 ^ 0xffU) & 1;
              }
              else {
                bVar1 = CompareFieldValueUsingParentFields
                                  (this,message2_local,pMStack_28,message1_fields_local._4_4_,field2
                                   ,-1,-1,parent_fields);
                local_c9 = (bVar1 ^ 0xffU) & 1;
                bVar1 = absl::lts_20240722::container_internal::
                        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        ::contains<google::protobuf::FieldDescriptor_const*>
                                  ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                                    *)&this->force_compare_no_presence_fields_,&field2);
                if (bVar1) {
                  psVar3 = FieldDescriptor::full_name_abi_cxx11_(field2);
                  absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::
                  emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                              *)&specific_field_5,
                             &(this->force_compare_failure_triggering_fields_).
                              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ,psVar3);
                }
                if (this->reporter_ != (Reporter *)0x0) {
                  pSVar4 = PushSpecificField(parent_fields);
                  pSVar4->message1 = message2_local;
                  pSVar4->message2 = pMStack_28;
                  pSVar4->unpacked_any = message1_fields_local._4_4_;
                  pSVar4->field = field2;
                  local_119 = false;
                  if ((this->force_compare_no_presence_ & 1U) != 0) {
                    local_119 = absl::lts_20240722::container_internal::
                                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                                ::contains<google::protobuf::FieldDescriptor_const*>
                                          ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                                            *)&this->force_compare_no_presence_fields_,&field2);
                  }
                  pSVar4->forced_compare_no_presence_ = local_119;
                  if ((local_c9 & 1) == 0) {
                    if ((this->report_matches_ & 1U) != 0) {
                      (*this->reporter_->_vptr_Reporter[6])
                                (this->reporter_,message2_local,pMStack_28,parent_fields);
                    }
                  }
                  else {
                    (*this->reporter_->_vptr_Reporter[4])
                              (this->reporter_,message2_local,pMStack_28,parent_fields);
                    field_index2._3_1_ = 1;
                  }
                  std::
                  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  ::pop_back(parent_fields);
                }
              }
            }
            if ((local_c9 & 1) != 0) {
              if (this->reporter_ == (Reporter *)0x0) {
                return false;
              }
              field_index2._3_1_ = 1;
            }
            local_48 = local_48 + 1;
            reflection1._4_4_ = reflection1._4_4_ + 1;
          }
        }
      }
      bVar1 = IsIgnored(this,message2_local,pMStack_28,field2,parent_fields);
      if (!bVar1) break;
      if (this->reporter_ != (Reporter *)0x0) {
        _i = PushSpecificField(parent_fields);
        _i->message1 = message2_local;
        _i->message2 = pMStack_28;
        _i->unpacked_any = message1_fields_local._4_4_;
        _i->field = field2;
        if ((this->report_ignores_ & 1U) != 0) {
          (*this->reporter_->_vptr_Reporter[7])
                    (this->reporter_,message2_local,pMStack_28,parent_fields);
        }
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::pop_back(parent_fields);
      }
      local_48 = local_48 + 1;
    }
    if (this->reporter_ == (Reporter *)0x0) {
      return false;
    }
    if (field2 == (FieldDescriptor *)0x0) break;
    bVar1 = FieldDescriptor::is_repeated(field2);
    if (bVar1) {
      local_fc = Reflection::FieldSize(reflection2,message2_local,field2);
    }
    else {
      local_fc = 1;
    }
    specific_field_1._4_4_ = local_fc;
    for (specific_field_1._0_4_ = 0; (int)specific_field_1 < specific_field_1._4_4_;
        specific_field_1._0_4_ = (int)specific_field_1 + 1) {
      pSStack_88 = PushSpecificField(parent_fields);
      pSStack_88->message1 = message2_local;
      pSStack_88->message2 = pMStack_28;
      pSStack_88->unpacked_any = message1_fields_local._4_4_;
      pSStack_88->field = field2;
      bVar1 = FieldDescriptor::is_repeated(field2);
      if (bVar1) {
        AddSpecificIndex(pSStack_88,message2_local,field2,(int)specific_field_1);
      }
      else {
        pSStack_88->index = -1;
      }
      (*this->reporter_->_vptr_Reporter[3])(this->reporter_,message2_local,pMStack_28,parent_fields)
      ;
      std::
      vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      ::pop_back(parent_fields);
    }
    field_index2._3_1_ = 1;
    local_48 = local_48 + 1;
  }
  __assert_fail("field1 != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                ,0x365,
                "bool google::protobuf::util::MessageDifferencer::CompareWithFieldsInternal(const Message &, const Message &, int, const std::vector<const FieldDescriptor *> &, const std::vector<const FieldDescriptor *> &, std::vector<SpecificField> *)"
               );
}

Assistant:

bool MessageDifferencer::CompareWithFieldsInternal(
    const Message& message1, const Message& message2, int unpacked_any,
    const std::vector<const FieldDescriptor*>& message1_fields,
    const std::vector<const FieldDescriptor*>& message2_fields,
    std::vector<SpecificField>* parent_fields) {
  bool isDifferent = false;
  int field_index1 = 0;
  int field_index2 = 0;

  const Reflection* reflection1 = message1.GetReflection();
  const Reflection* reflection2 = message2.GetReflection();

  while (true) {
    const FieldDescriptor* field1 = message1_fields[field_index1];
    const FieldDescriptor* field2 = message2_fields[field_index2];

    // Once we have reached sentinel values, we are done the comparison.
    if (field1 == NULL && field2 == NULL) {
      break;
    }

    // Check for differences in the field itself.
    if (FieldBefore(field1, field2)) {
      // Field 1 is not in the field list for message 2.
      if (IsIgnored(message1, message2, field1, *parent_fields)) {
        // We are ignoring field1. Report the ignore and move on to
        // the next field in message1_fields.
        if (reporter_ != NULL) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1;
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field1;
          if (report_ignores_) {
            reporter_->ReportIgnored(message1, message2, *parent_fields);
          }
          parent_fields->pop_back();
        }
        ++field_index1;
        continue;
      }

      if (reporter_ != NULL) {
        assert(field1 != NULL);
        int count = field1->is_repeated()
                        ? reflection1->FieldSize(message1, field1)
                        : 1;

        for (int i = 0; i < count; ++i) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1;
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field1;
          if (field1->is_repeated()) {
            AddSpecificIndex(&specific_field, message1, field1, i);
          } else {
            specific_field.index = -1;
          }

          reporter_->ReportDeleted(message1, message2, *parent_fields);
          parent_fields->pop_back();
        }

        isDifferent = true;
      } else {
        return false;
      }

      ++field_index1;
      continue;
    } else if (FieldBefore(field2, field1)) {
      const bool ignore_field =
          IsIgnored(message1, message2, field2, *parent_fields);
      if (!ignore_field && force_compare_no_presence_fields_.contains(field2)) {
        force_compare_failure_triggering_fields_.emplace(field2->full_name());
      }

      // Field 2 is not in the field list for message 1.
      if (ignore_field) {
        // We are ignoring field2. Report the ignore and move on to
        // the next field in message2_fields.
        if (reporter_ != NULL) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1;
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field2;
          if (report_ignores_) {
            reporter_->ReportIgnored(message1, message2, *parent_fields);
          }
          parent_fields->pop_back();
        }
        ++field_index2;
        continue;
      }

      if (reporter_ != NULL) {
        int count = field2->is_repeated()
                        ? reflection2->FieldSize(message2, field2)
                        : 1;

        for (int i = 0; i < count; ++i) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1,
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field2;
          if (field2->is_repeated()) {
            specific_field.index = i;
            AddSpecificNewIndex(&specific_field, message2, field2, i);
          } else {
            specific_field.index = -1;
            specific_field.new_index = -1;
          }

          specific_field.forced_compare_no_presence_ =
              force_compare_no_presence_ &&
              force_compare_no_presence_fields_.contains(specific_field.field);

          reporter_->ReportAdded(message1, message2, *parent_fields);
          parent_fields->pop_back();
        }

        isDifferent = true;
      } else {
        return false;
      }

      ++field_index2;
      continue;
    }

    // By this point, field1 and field2 are guaranteed to point to the same
    // field, so we can now compare the values.
    if (IsIgnored(message1, message2, field1, *parent_fields)) {
      // Ignore this field. Report and move on.
      if (reporter_ != NULL) {
        SpecificField& specific_field = PushSpecificField(parent_fields);
        specific_field.message1 = &message1;
        specific_field.message2 = &message2;
        specific_field.unpacked_any = unpacked_any;
        specific_field.field = field1;
        if (report_ignores_) {
          reporter_->ReportIgnored(message1, message2, *parent_fields);
        }
        parent_fields->pop_back();
      }

      ++field_index1;
      ++field_index2;
      continue;
    }

    bool fieldDifferent = false;
    assert(field1 != NULL);
    if (field1->is_map()) {
      fieldDifferent = !CompareMapField(message1, message2, unpacked_any,
                                        field1, parent_fields);
    } else if (field1->is_repeated()) {
      fieldDifferent = !CompareRepeatedField(message1, message2, unpacked_any,
                                             field1, parent_fields);
    } else {
      fieldDifferent = !CompareFieldValueUsingParentFields(
          message1, message2, unpacked_any, field1, -1, -1, parent_fields);

      if (force_compare_no_presence_fields_.contains(field1)) {
        force_compare_failure_triggering_fields_.emplace(field1->full_name());
      }

      if (reporter_ != nullptr) {
        SpecificField& specific_field = PushSpecificField(parent_fields);
        specific_field.message1 = &message1;
        specific_field.message2 = &message2;
        specific_field.unpacked_any = unpacked_any;
        specific_field.field = field1;
        specific_field.forced_compare_no_presence_ =
            force_compare_no_presence_ &&
            force_compare_no_presence_fields_.contains(field1);

        if (fieldDifferent) {
          reporter_->ReportModified(message1, message2, *parent_fields);
          isDifferent = true;
        } else if (report_matches_) {
          reporter_->ReportMatched(message1, message2, *parent_fields);
        }
        parent_fields->pop_back();
      }
    }
    if (fieldDifferent) {
      if (reporter_ == nullptr) return false;
      isDifferent = true;
    }
    // Increment the field indices.
    ++field_index1;
    ++field_index2;
  }

  return !isDifferent;
}